

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGhsMultiGenerator::AddAllTarget(cmGlobalGhsMultiGenerator *this)

{
  cmLocalGenerator *pcVar1;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  undefined4 extraout_var;
  cmTarget *pcVar6;
  string *name;
  _Base_ptr p_Var7;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *tgt;
  undefined8 *puVar8;
  _Base_ptr p_Var9;
  allocator<char> local_a1;
  __single_object cc;
  cmTarget *allBuild;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_90;
  _Rb_tree_node_base *local_88;
  _Base_ptr local_80;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_78;
  allocator<char> local_70 [32];
  string local_50;
  
  local_88 = &(this->super_cmGlobalGenerator).ProjectMap._M_t._M_impl.super__Rb_tree_header.
              _M_header;
  for (p_Var7 = (this->super_cmGlobalGenerator).ProjectMap._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left; p_Var7 != local_88;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    if (*(_Base_ptr *)(p_Var7 + 2) != p_Var7[2]._M_parent) {
      std::make_unique<cmCustomCommand>();
      cmCustomCommand::SetEscapeOldStyle
                ((cmCustomCommand *)
                 cc._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,false);
      cmCustomCommand::SetComment
                ((cmCustomCommand *)
                 cc._M_t.
                 super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
                 super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                 super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,"Build all projects");
      pcVar1 = (cmLocalGenerator *)**(undefined8 **)(p_Var7 + 2);
      iVar4 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1b])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar4),local_70);
      local_90._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
      _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
           _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
           super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
      cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
      super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
      super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
           (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
      pcVar6 = cmLocalGenerator::AddUtilityCommand(pcVar1,&local_50,true,&local_90);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                (&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      pcVar1 = (cmLocalGenerator *)**(undefined8 **)(p_Var7 + 2);
      allBuild = pcVar6;
      std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*const&>
                ((cmTarget **)&local_78,(cmLocalGenerator **)&allBuild);
      cmLocalGenerator::AddGeneratorTarget(pcVar1,&local_78);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                (&local_78);
      iVar4 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x2e])(this);
      pcVar6 = allBuild;
      if ((char)iVar4 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"FOLDER",&local_a1);
        cmGlobalGenerator::GetPredefinedTargetsFolder_abi_cxx11_
                  ((string *)local_70,&this->super_cmGlobalGenerator);
        cmTarget::SetProperty(pcVar6,&local_50,(string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
      local_80 = p_Var7[2]._M_parent;
      for (p_Var9 = *(_Base_ptr *)(p_Var7 + 2); p_Var9 != local_80;
          p_Var9 = (_Base_ptr)&p_Var9->_M_parent) {
        puVar2 = *(undefined8 **)(*(long *)p_Var9 + 0x150);
        for (puVar8 = *(undefined8 **)(*(long *)p_Var9 + 0x148); puVar8 != puVar2;
            puVar8 = puVar8 + 1) {
          TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)*puVar8);
          if (TVar5 != GLOBAL_TARGET) {
            bVar3 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)*puVar8);
            if (!bVar3) {
              bVar3 = cmGlobalGenerator::IsExcluded
                                (&this->super_cmGlobalGenerator,
                                 (cmLocalGenerator *)**(undefined8 **)(p_Var7 + 2),
                                 (cmGeneratorTarget *)*puVar8);
              pcVar6 = allBuild;
              if (!bVar3) {
                name = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)*puVar8);
                cmTarget::AddUtility(pcVar6,name,false,(cmMakefile *)0x0);
              }
            }
          }
        }
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
    }
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::AddAllTarget()
{
  // Add a special target that depends on ALL projects for easy build
  // of one configuration only.
  for (auto const& it : this->ProjectMap) {
    std::vector<cmLocalGenerator*> const& gen = it.second;
    // add the ALL_BUILD to the first local generator of each project
    if (!gen.empty()) {
      // Use no actual command lines so that the target itself is not
      // considered always out of date.
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetEscapeOldStyle(false);
      cc->SetComment("Build all projects");
      cmTarget* allBuild = gen[0]->AddUtilityCommand(this->GetAllTargetName(),
                                                     true, std::move(cc));

      gen[0]->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(allBuild, gen[0]));

      // Organize in the "predefined targets" folder:
      if (this->UseFolderProperty()) {
        allBuild->SetProperty("FOLDER", this->GetPredefinedTargetsFolder());
      }

      // Now make all targets depend on the ALL_BUILD target
      for (cmLocalGenerator const* i : gen) {
        for (const auto& tgt : i->GetGeneratorTargets()) {
          // Skip global or imported targets
          if (tgt->GetType() == cmStateEnums::GLOBAL_TARGET ||
              tgt->IsImported()) {
            continue;
          }
          // Skip Exclude From All Targets
          if (!this->IsExcluded(gen[0], tgt.get())) {
            allBuild->AddUtility(tgt->GetName(), false);
          }
        }
      }
    }
  }
}